

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

anon_struct_8_2_dd000bf7_for__M_head_impl * __thiscall
testing::internal::ValuesInIteratorRangeGenerator<(anonymous_namespace)::QuantParam>::Iterator::
Current(Iterator *this)

{
  pointer __old_p;
  anon_struct_8_2_dd000bf7_for__M_head_impl *paVar1;
  
  __old_p = (this->value_)._M_t.
            super___uniq_ptr_impl<const_(anonymous_namespace)::QuantParam,_std::default_delete<const_(anonymous_namespace)::QuantParam>_>
            ._M_t.
            super__Tuple_impl<0UL,_const_(anonymous_namespace)::QuantParam_*,_std::default_delete<const_(anonymous_namespace)::QuantParam>_>
            .super__Head_base<0UL,_const_(anonymous_namespace)::QuantParam_*,_false>._M_head_impl;
  if (__old_p != (pointer)0x0) {
    return __old_p;
  }
  paVar1 = (anon_struct_8_2_dd000bf7_for__M_head_impl *)operator_new(8);
  *paVar1 = *(this->iterator_)._M_current;
  (this->value_)._M_t.
  super___uniq_ptr_impl<const_(anonymous_namespace)::QuantParam,_std::default_delete<const_(anonymous_namespace)::QuantParam>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_(anonymous_namespace)::QuantParam_*,_std::default_delete<const_(anonymous_namespace)::QuantParam>_>
  .super__Head_base<0UL,_const_(anonymous_namespace)::QuantParam_*,_false>._M_head_impl = paVar1;
  return paVar1;
}

Assistant:

const T* Current() const override {
      if (value_.get() == nullptr) value_.reset(new T(*iterator_));
      return value_.get();
    }